

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

char * mcpl_internal_calloc(size_t num,size_t size)

{
  char *pcVar1;
  
  pcVar1 = (char *)calloc(num + (num == 0),size + (size == 0));
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  (*mcpl_error_handler)("memory allocation failed");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

MCPL_LOCAL char * mcpl_internal_calloc(size_t num, size_t size)
{
  char * res = (char*)calloc( ( num ? num : 1 ),
                              ( size ? size : 1 ) );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}